

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.c
# Opt level: O0

feed_db_status_t store_calendar_record_db(calendar_record_t *record,feed_db_t *db)

{
  int iVar1;
  char *pcVar2;
  char local_d8 [8];
  char qr [166];
  sqlite3_stmt *local_28;
  sqlite3_stmt *stmt;
  feed_db_t *db_local;
  calendar_record_t *record_local;
  
  stmt = (sqlite3_stmt *)db;
  db_local = (feed_db_t *)record;
  memcpy(local_d8,
         "INSERT INTO calendar (service_id,monday, tuesday, wednesday, thursday, friday, saturday, sunday,start_date, end_date) values (?1,?2, ?3, ?4, ?5, ?6, ?7, ?8,?9, ?10);"
         ,0xa6);
  sqlite3_prepare_v2(*(sqlite3 **)(stmt + 8),local_d8,-1,&local_28,(char **)0x0);
  sqlite3_bind_text(local_28,1,(char *)db_local,-1,(_func_void_void_ptr *)0x0);
  sqlite3_bind_int(local_28,2,db_local[1].rc);
  sqlite3_bind_int(local_28,3,db_local[1].open);
  sqlite3_bind_int(local_28,4,db_local[1].in_transaction);
  sqlite3_bind_int(local_28,5,*(int *)&db_local[1].field_0x24);
  sqlite3_bind_int(local_28,6,*(int *)&db_local[2].path);
  sqlite3_bind_int(local_28,7,*(int *)((long)&db_local[2].path + 4));
  sqlite3_bind_int(local_28,8,*(int *)&db_local[2].conn);
  sqlite3_bind_text(local_28,9,(char *)((long)&db_local[2].conn + 4),-1,(_func_void_void_ptr *)0x0);
  sqlite3_bind_text(local_28,10,(char *)((long)&db_local[2].error_msg + 5),-1,
                    (_func_void_void_ptr *)0x0);
  iVar1 = sqlite3_step(local_28);
  *(int *)(stmt + 0x18) = iVar1;
  iVar1 = *(int *)(stmt + 0x18);
  if (iVar1 == 0x65) {
    sqlite3_finalize(local_28);
  }
  else {
    pcVar2 = sqlite3_errmsg(*(sqlite3 **)(stmt + 8));
    pcVar2 = strdup(pcVar2);
    *(char **)(stmt + 0x10) = pcVar2;
    sqlite3_finalize(local_28);
  }
  record_local._4_4_ = (feed_db_status_t)(iVar1 == 0x65);
  return record_local._4_4_;
}

Assistant:

feed_db_status_t store_calendar_record_db(calendar_record_t *record, feed_db_t *db) {
    sqlite3_stmt *stmt;
    char qr[] = "INSERT INTO calendar ("
                    "service_id,"
                    "monday, tuesday, wednesday, thursday, friday, saturday, sunday,"
                    "start_date, end_date"
                ") values ("
                    "?1,"
                    "?2, ?3, ?4, ?5, ?6, ?7, ?8,"
                    "?9, ?10"
                ");";

    sqlite3_prepare_v2(db->conn, qr, -1, &stmt, NULL);

    sqlite3_bind_text(stmt, 1, record->service_id, -1, SQLITE_STATIC);
    sqlite3_bind_int(stmt, 2, (int)record->monday);
    sqlite3_bind_int(stmt, 3, (int)record->tuesday);
    sqlite3_bind_int(stmt, 4, (int)record->wednesday);
    sqlite3_bind_int(stmt, 5, (int)record->thursday);
    sqlite3_bind_int(stmt, 6, (int)record->friday);
    sqlite3_bind_int(stmt, 7, (int)record->saturday);
    sqlite3_bind_int(stmt, 8, (int)record->sunday);
    sqlite3_bind_text(stmt, 9, record->start_date, -1, SQLITE_STATIC);
    sqlite3_bind_text(stmt, 10, record->end_date, -1, SQLITE_STATIC);

    db->rc = sqlite3_step(stmt);
    if (db->rc != SQLITE_DONE) {
        db->error_msg = strdup(sqlite3_errmsg(db->conn));
        sqlite3_finalize(stmt);
        return FEED_DB_ERROR;
    }

    sqlite3_finalize(stmt);
    return FEED_DB_SUCCESS;
}